

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::Read
          (PosixSequentialFile *this,size_t n,Slice *result,char *scratch)

{
  int iVar1;
  Slice *pSVar2;
  int *piVar3;
  _func_int **pp_Var4;
  void *in_R8;
  char *local_30;
  
  (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)0x0;
  pSVar2 = (Slice *)fread_unlocked(in_R8,1,(size_t)result,*(FILE **)(n + 0x28));
  *(void **)scratch = in_R8;
  *(Slice **)(scratch + 8) = pSVar2;
  if (pSVar2 < result) {
    iVar1 = feof(*(FILE **)(n + 0x28));
    if (iVar1 == 0) {
      piVar3 = __errno_location();
      IOError((anon_unknown_1 *)&local_30,(string *)(n + 8),*piVar3);
      if (local_30 != (char *)0x0) {
        if (local_30 == (char *)0x0) {
          pp_Var4 = (_func_int **)0x0;
        }
        else {
          pp_Var4 = (_func_int **)Status::CopyState(local_30);
        }
        (this->super_SequentialFile)._vptr_SequentialFile = pp_Var4;
      }
      if (local_30 != (char *)0x0) {
        operator_delete__(local_30);
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Read(size_t n, Slice *result, char *scratch) {
                Status s;
                size_t r = fread_unlocked(scratch, 1, n, file_);
                *result = Slice(scratch, r);
                if (r < n) {
                    if (feof(file_)) {
                        // We leave status as ok if we hit the end of the file
                    } else {
                        // A partial read with an error: return a non-ok status
                        s = IOError(filename_, errno);
                    }
                }
                return s;
            }